

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

void __thiscall LexicalAnalyzer::lookingForEndOfStatement(LexicalAnalyzer *this,string *str)

{
  pointer pcVar1;
  ostream *poVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  
  cVar3 = (char)this + '0';
  pcVar1 = (str->_M_dataplus)._M_p;
  uVar4 = 0;
  bVar5 = false;
  do {
    if (pcVar1[uVar4] != ' ') {
      if (pcVar1[uVar4] == ';') {
        std::__cxx11::string::push_back(cVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->m_Statement)._M_dataplus._M_p,
                            (this->m_Statement)._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        return;
      }
      if (bVar5) {
        std::__cxx11::string::push_back(cVar3);
        pcVar1 = (str->_M_dataplus)._M_p;
      }
      bVar5 = (bool)(bVar5 | pcVar1[uVar4] == '{');
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void LexicalAnalyzer::lookingForEndOfStatement(string str){
    unsigned index = 0;
    bool fOpened = false;
    for(index; ;index++){
        if(str[index] == ' ')
            continue;
        if(str[index] == ';'){
            m_Statement.push_back(str[index]);
            break;
        }

        if(fOpened)
            m_Statement.push_back(str[index]);
        if(str[index] == '{')
            fOpened = true;
    }
    cout << m_Statement << endl;
    return;
}